

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::OutputTestCases(JunitReporter *this,XmlWriter *xml,Stats *stats)

{
  bool bVar1;
  ulong uVar2;
  XmlWriter *in_RSI;
  string stdErr;
  string stdOut;
  ScopedElement e;
  const_iterator itEnd;
  const_iterator it;
  vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  *in_stack_fffffffffffffe08;
  XmlWriter *in_stack_fffffffffffffe10;
  allocator *in_stack_fffffffffffffe18;
  XmlWriter *in_stack_fffffffffffffe20;
  XmlWriter *in_stack_fffffffffffffe30;
  XmlWriter *in_stack_fffffffffffffe38;
  XmlWriter *str;
  allocator local_179;
  string local_178 [40];
  TestCaseStats *in_stack_fffffffffffffeb0;
  XmlWriter *in_stack_fffffffffffffeb8;
  JunitReporter *in_stack_fffffffffffffec0;
  allocator local_129;
  string local_128 [40];
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [40];
  TestCaseStats *local_28;
  __normal_iterator<const_Catch::JunitReporter::TestCaseStats_*,_std::vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>_>
  local_20 [2];
  XmlWriter *local_10;
  
  local_10 = in_RSI;
  local_20[0]._M_current =
       (TestCaseStats *)
       std::
       vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
       ::begin(in_stack_fffffffffffffe08);
  local_28 = (TestCaseStats *)
             std::
             vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
             ::end(in_stack_fffffffffffffe08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::JunitReporter::TestCaseStats_*,_std::vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>_>
                        *)in_stack_fffffffffffffe10,
                       (__normal_iterator<const_Catch::JunitReporter::TestCaseStats_*,_std::vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>_>
                        *)in_stack_fffffffffffffe08);
    if (!bVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"testcase",&local_51);
    XmlWriter::scopedElement(in_stack_fffffffffffffe38,(string *)in_stack_fffffffffffffe30);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"classname",&local_89);
    __gnu_cxx::
    __normal_iterator<const_Catch::JunitReporter::TestCaseStats_*,_std::vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>_>
    ::operator->(local_20);
    XmlWriter::writeAttribute
              (in_stack_fffffffffffffe20,(string *)in_stack_fffffffffffffe18,
               (string *)in_stack_fffffffffffffe10);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    str = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"name",&local_b1);
    __gnu_cxx::
    __normal_iterator<const_Catch::JunitReporter::TestCaseStats_*,_std::vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>_>
    ::operator->(local_20);
    XmlWriter::writeAttribute
              (in_stack_fffffffffffffe20,(string *)in_stack_fffffffffffffe18,
               (string *)in_stack_fffffffffffffe10);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    in_stack_fffffffffffffe38 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"time",&local_d9);
    XmlWriter::writeAttribute<char[4]>
              (in_stack_fffffffffffffe20,(string *)in_stack_fffffffffffffe18,
               &in_stack_fffffffffffffe10->m_tagIsOpen);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    in_stack_fffffffffffffe30 = local_10;
    __gnu_cxx::
    __normal_iterator<const_Catch::JunitReporter::TestCaseStats_*,_std::vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>_>
    ::operator*(local_20);
    OutputTestResult(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    __gnu_cxx::
    __normal_iterator<const_Catch::JunitReporter::TestCaseStats_*,_std::vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>_>
    ::operator->(local_20);
    trim((string *)str);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      in_stack_fffffffffffffe20 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"system-out",&local_129);
      XmlWriter::scopedElement(in_stack_fffffffffffffe38,(string *)in_stack_fffffffffffffe30);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffe20,(string *)in_stack_fffffffffffffe18,
                 SUB81((ulong)in_stack_fffffffffffffe10 >> 0x38,0));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffe10);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::JunitReporter::TestCaseStats_*,_std::vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>_>
    ::operator->(local_20);
    trim((string *)str);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      in_stack_fffffffffffffe18 = &local_179;
      in_stack_fffffffffffffe10 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,"system-err",in_stack_fffffffffffffe18);
      XmlWriter::scopedElement(in_stack_fffffffffffffe38,(string *)in_stack_fffffffffffffe30);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffe20,(string *)in_stack_fffffffffffffe18,
                 SUB81((ulong)in_stack_fffffffffffffe10 >> 0x38,0));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffe10);
      std::__cxx11::string::~string(local_178);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
    }
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
    std::__cxx11::string::~string(local_100);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffe10);
    __gnu_cxx::
    __normal_iterator<const_Catch::JunitReporter::TestCaseStats_*,_std::vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void OutputTestCases( XmlWriter& xml, const Stats& stats ) {
            std::vector<TestCaseStats>::const_iterator it = stats.m_testCaseStats.begin();
            std::vector<TestCaseStats>::const_iterator itEnd = stats.m_testCaseStats.end();
            for(; it != itEnd; ++it ) {

                XmlWriter::ScopedElement e = xml.scopedElement( "testcase" );
                xml.writeAttribute( "classname", it->m_className );
                xml.writeAttribute( "name", it->m_name );
                xml.writeAttribute( "time", "tbd" );

                OutputTestResult( xml, *it );

                std::string stdOut = trim( it->m_stdOut );
                if( !stdOut.empty() )
                    xml.scopedElement( "system-out" ).writeText( stdOut, false );
                std::string stdErr = trim( it->m_stdErr );
                if( !stdErr.empty() )
                    xml.scopedElement( "system-err" ).writeText( stdErr, false );
            }
        }